

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  uhugeint_t local_38;
  uhugeint_t local_28;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  pauVar1 = *(undefined1 (**) [16])(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    local_28.lower = **(uint64_t **)(left + 0x20);
    local_28.upper = (*(uint64_t **)(left + 0x20))[1];
    local_38.lower = **(uint64_t **)(right + 0x20);
    local_38.upper = (*(uint64_t **)(right + 0x20))[1];
    auVar2 = duckdb::uhugeint_t::operator^(&local_28,&local_38);
    *pauVar1 = auVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}